

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

PMJ02BNSampler *
pbrt::PMJ02BNSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  PMJ02BNSampler *pPVar4;
  polymorphic_allocator<std::byte> *in_RDI;
  int seed;
  int nsamp;
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  polymorphic_allocator<std::byte> *local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar2 = ParameterDictionary::GetOneInt
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = iVar2;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x44));
  if (bVar1) {
    piVar3 = pstd::optional<int>::operator*((optional<int> *)0x4646d8);
    local_1c = *piVar3;
  }
  if ((*(byte *)(Options + 0x54) & 1) != 0) {
    local_1c = 1;
  }
  piVar3 = (int *)&stack0xffffffffffffff87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  ParameterDictionary::GetOneInt
            ((ParameterDictionary *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48,0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  pPVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PMJ02BNSampler,int&,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (in_RDI,(int *)CONCAT44(iVar2,in_stack_ffffffffffffff68),piVar3,local_10);
  return pPVar4;
}

Assistant:

PMJ02BNSampler *PMJ02BNSampler::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);
    return alloc.new_object<PMJ02BNSampler>(nsamp, seed, alloc);
}